

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O3

float units::detail::power_const<float>(float val,int power)

{
  float fVar1;
  float fVar2;
  
  if (power < 2) {
    if (power < -1) {
      fVar2 = power_const<float>(val,(uint)-power >> 1);
      fVar1 = 1.0;
      if ((-power & 1U) != 0) {
        fVar1 = val;
      }
      fVar1 = 1.0 / (fVar1 * fVar2 * fVar2);
    }
    else {
      fVar1 = val;
      if ((power != 1) && (fVar1 = 1.0, power == -1)) {
        fVar1 = 1.0 / val;
      }
    }
  }
  else {
    fVar1 = power_const<float>(val,(uint)power >> 1);
    if ((power & 1U) == 0) {
      val = 1.0;
    }
    fVar1 = val * fVar1 * fVar1;
  }
  return fVar1;
}

Assistant:

constexpr X power_const(X val, int power)
    {
        return (power > 1) ? sqr_power(power_const(val, power / 2)) *
                (power % 2 == 0 ? X{1.0} : val) :
            (power < -1) ? X{1.0} /
                (sqr_power(power_const(val, (-power) / 2)) *
                 ((-power) % 2 == 0 ? X{1.0} : val)) :
                           power_const_small(val, power);
    }